

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O3

bool __thiscall QToolButton::event(QToolButton *this,QEvent *event)

{
  QToolButtonPrivate *this_00;
  bool bVar1;
  QHoverEvent *he;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(ushort *)(event + 8) - 0x7f < 3) {
    this_00 = *(QToolButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    auVar3 = QEventPoint::position();
    dVar2 = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._0_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_28.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    dVar2 = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._8_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_28.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    QToolButtonPrivate::updateHoverControl(this_00,&local_28);
  }
  bVar1 = QAbstractButton::event(&this->super_QAbstractButton,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QToolButton::event(QEvent *event)
{
    switch(event->type()) {
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
    case QEvent::HoverMove:
        if (const QHoverEvent *he = static_cast<const QHoverEvent *>(event))
            d_func()->updateHoverControl(he->position().toPoint());
        break;
    default:
        break;
    }
    return QAbstractButton::event(event);
}